

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstobin.cpp
# Opt level: O1

void lossfactorstobin::DoIt(void)

{
  amplification_factor aVar1;
  iterator iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 extraout_RAX;
  int iVar5;
  int iVar6;
  amplification_factor *paVar7;
  event_amplification ea;
  vector<amplification_factor,_std::allocator<amplification_factor>_> factors;
  amplification_factor af;
  amplification_factor af_1;
  float factor;
  char line [4096];
  int local_1074;
  int local_1070;
  int local_106c;
  amplification_factor *local_1068;
  iterator iStack_1060;
  amplification_factor *local_1058;
  amplification_factor local_1050;
  amplification_factor local_1048;
  float local_103c;
  char local_1038 [4104];
  
  local_1038[0] = '\0';
  local_1038[1] = '\0';
  local_1038[2] = '\0';
  local_1038[3] = '\0';
  fwrite(local_1038,4,1,_stdout);
  local_1068 = (amplification_factor *)0x0;
  iStack_1060._M_current = (amplification_factor *)0x0;
  local_1058 = (amplification_factor *)0x0;
  fgets(local_1038,0x1000,_stdin);
  pcVar4 = fgets(local_1038,0x1000,_stdin);
  if (pcVar4 == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar6 = 0;
    iVar5 = 0;
    do {
      iVar3 = __isoc99_sscanf(local_1038,"%d,%d,%f",&local_1074,&local_1070,&local_103c);
      if (iVar3 != 3) {
        DoIt();
        if (local_1068 != (amplification_factor *)0x0) {
          operator_delete(local_1068);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (local_1074 != iVar6) {
        if (iVar6 != 0) {
          local_106c = iVar5;
          fwrite(&local_106c,4,1,_stdout);
          iVar2._M_current = iStack_1060._M_current;
          for (paVar7 = local_1068; paVar7 != iVar2._M_current; paVar7 = paVar7 + 1) {
            local_1048 = *paVar7;
            fwrite(&local_1048,8,1,_stdout);
          }
        }
        fwrite(&local_1074,4,1,_stdout);
        iVar6 = local_1074;
        iVar5 = 0;
        if (iStack_1060._M_current != local_1068) {
          iStack_1060._M_current = local_1068;
          iVar5 = 0;
        }
      }
      local_1050.amplification_id = local_1070;
      local_1050.factor = local_103c;
      if (iStack_1060._M_current == local_1058) {
        std::vector<amplification_factor,std::allocator<amplification_factor>>::
        _M_realloc_insert<amplification_factor_const&>
                  ((vector<amplification_factor,std::allocator<amplification_factor>> *)&local_1068,
                   iStack_1060,&local_1050);
      }
      else {
        aVar1.factor = local_103c;
        aVar1.amplification_id = local_1070;
        *iStack_1060._M_current = aVar1;
        iStack_1060._M_current = iStack_1060._M_current + 1;
      }
      iVar5 = iVar5 + 1;
      pcVar4 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar4 != (char *)0x0);
  }
  local_106c = iVar5;
  fwrite(&local_106c,4,1,_stdout);
  iVar2._M_current = iStack_1060._M_current;
  if (local_1068 != iStack_1060._M_current) {
    paVar7 = local_1068;
    do {
      local_1048 = *paVar7;
      fwrite(&local_1048,8,1,_stdout);
      paVar7 = paVar7 + 1;
    } while (paVar7 != iVar2._M_current);
  }
  if (local_1068 != (amplification_factor *)0x0) {
    operator_delete(local_1068);
  }
  return;
}

Assistant:

void DoIt() {

    WriteOpts();

    int current_event_id = 0;
    int counter = 0;
    event_amplification ea;
    amplification_factor af;
    std::vector<amplification_factor> factors;
    float factor;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d,%f", &ea.event_id, &ea.amplification_id,
		 &factor) != 3) {
	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (ea.event_id != current_event_id) {
	if (current_event_id != 0) {
	  WriteCounterAmplitudesAndFactors(counter, factors);
	}
	fwrite(&ea.event_id, sizeof(ea.event_id), 1, stdout);
	current_event_id = ea.event_id;
	counter = 0;
	factors.clear();
      }

      af.amplification_id = ea.amplification_id;
      af.factor = factor;
      factors.push_back(af);
      ++counter;
      ++lineno;

    }

    WriteCounterAmplitudesAndFactors(counter, factors);

  }